

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

int32_t ucnv_fromUChars_63(UConverter *cnv,char *dest,int32_t destCapacity,UChar *src,
                          int32_t srcLength,UErrorCode *pErrorCode)

{
  char *dest_00;
  UBool UVar1;
  UChar *sourceLimit;
  char local_468 [8];
  char buffer [1024];
  int32_t local_5c;
  int32_t destLength;
  char *destLimit;
  char *originalDest;
  UChar *srcLimit;
  UErrorCode *pErrorCode_local;
  UChar *pUStack_30;
  int32_t srcLength_local;
  UChar *src_local;
  char *pcStack_20;
  int32_t destCapacity_local;
  char *dest_local;
  UConverter *cnv_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) ||
     (pUStack_30 = src, src_local._4_4_ = destCapacity, pcStack_20 = dest, dest_local = (char *)cnv,
     UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    cnv_local._4_4_ = 0;
  }
  else if (((dest_local == (char *)0x0) || (src_local._4_4_ < 0)) ||
          ((((0 < src_local._4_4_ && (pcStack_20 == (char *)0x0)) || (srcLength < -1)) ||
           ((srcLength != 0 && (pUStack_30 == (UChar *)0x0)))))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    cnv_local._4_4_ = 0;
  }
  else {
    ucnv_resetFromUnicode_63((UConverter *)dest_local);
    dest_00 = pcStack_20;
    pErrorCode_local._4_4_ = srcLength;
    if (srcLength == -1) {
      pErrorCode_local._4_4_ = u_strlen_63(pUStack_30);
    }
    if (pErrorCode_local._4_4_ < 1) {
      local_5c = 0;
    }
    else {
      sourceLimit = pUStack_30 + pErrorCode_local._4_4_;
      src_local._4_4_ = pinCapacity<char>(pcStack_20,src_local._4_4_);
      ucnv_fromUnicode_63((UConverter *)dest_local,&stack0xffffffffffffffe0,
                          pcStack_20 + src_local._4_4_,&stack0xffffffffffffffd0,sourceLimit,
                          (int32_t *)0x0,'\x01',pErrorCode);
      local_5c = (int)pcStack_20 - (int)dest_00;
      if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
        do {
          pcStack_20 = local_468;
          *pErrorCode = U_ZERO_ERROR;
          ucnv_fromUnicode_63((UConverter *)dest_local,&stack0xffffffffffffffe0,buffer + 0x3f8,
                              &stack0xffffffffffffffd0,sourceLimit,(int32_t *)0x0,'\x01',pErrorCode)
          ;
          local_5c = ((int)pcStack_20 - (int)local_468) + local_5c;
        } while (*pErrorCode == U_BUFFER_OVERFLOW_ERROR);
      }
    }
    cnv_local._4_4_ = u_terminateChars_63(dest_00,src_local._4_4_,local_5c,pErrorCode);
  }
  return cnv_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_fromUChars(UConverter *cnv,
                char *dest, int32_t destCapacity,
                const UChar *src, int32_t srcLength,
                UErrorCode *pErrorCode) {
    const UChar *srcLimit;
    char *originalDest, *destLimit;
    int32_t destLength;

    /* check arguments */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( cnv==NULL ||
        destCapacity<0 || (destCapacity>0 && dest==NULL) ||
        srcLength<-1 || (srcLength!=0 && src==NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* initialize */
    ucnv_resetFromUnicode(cnv);
    originalDest=dest;
    if(srcLength==-1) {
        srcLength=u_strlen(src);
    }
    if(srcLength>0) {
        srcLimit=src+srcLength;
        destCapacity=pinCapacity(dest, destCapacity);
        destLimit=dest+destCapacity;

        /* perform the conversion */
        ucnv_fromUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
        destLength=(int32_t)(dest-originalDest);

        /* if an overflow occurs, then get the preflighting length */
        if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR) {
            char buffer[1024];

            destLimit=buffer+sizeof(buffer);
            do {
                dest=buffer;
                *pErrorCode=U_ZERO_ERROR;
                ucnv_fromUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
                destLength+=(int32_t)(dest-buffer);
            } while(*pErrorCode==U_BUFFER_OVERFLOW_ERROR);
        }
    } else {
        destLength=0;
    }

    return u_terminateChars(originalDest, destCapacity, destLength, pErrorCode);
}